

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O1

size_t * IsoSpec::get_inverse_order<double>(double *order_array,size_t N)

{
  undefined1 auVar1 [16];
  unsigned_long *__first;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  double *local_20;
  long lVar5;
  
  local_20 = order_array;
  __first = (unsigned_long *)operator_new__(-(ulong)(N >> 0x3d != 0) | N * 8);
  auVar1 = _DAT_001201e0;
  if (N != 0) {
    lVar5 = N - 1;
    auVar3._8_4_ = (int)lVar5;
    auVar3._0_8_ = lVar5;
    auVar3._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar2 = 0;
    auVar3 = auVar3 ^ _DAT_001201e0;
    auVar4 = _DAT_001201d0;
    do {
      auVar6 = auVar4 ^ auVar1;
      if ((bool)(~(auVar6._4_4_ == auVar3._4_4_ && auVar3._0_4_ < auVar6._0_4_ ||
                  auVar3._4_4_ < auVar6._4_4_) & 1)) {
        __first[uVar2] = uVar2;
      }
      if ((auVar6._12_4_ != auVar3._12_4_ || auVar6._8_4_ <= auVar3._8_4_) &&
          auVar6._12_4_ <= auVar3._12_4_) {
        __first[uVar2 + 1] = uVar2 + 1;
      }
      uVar2 = uVar2 + 2;
      lVar5 = auVar4._8_8_;
      auVar4._0_8_ = auVar4._0_8_ + 2;
      auVar4._8_8_ = lVar5 + 2;
    } while ((N + 1 & 0xfffffffffffffffe) != uVar2);
    lVar5 = 0x3f;
    if (N != 0) {
      for (; N >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<IsoSpec::get_inverse_order<double>(double*,unsigned_long)::_lambda(int,int)_1_>>
              (__first,__first + N,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MatteoLacki[P]IsoSpec_IsoSpec___misc_h:168:29)>
                )&local_20);
    std::
    __final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<IsoSpec::get_inverse_order<double>(double*,unsigned_long)::_lambda(int,int)_1_>>
              (__first,__first + N,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MatteoLacki[P]IsoSpec_IsoSpec___misc_h:168:29)>
                )&local_20);
  }
  return __first;
}

Assistant:

size_t* get_inverse_order(T* order_array, size_t N)
{
    size_t* arr = new size_t[N];
    for(size_t ii = 0; ii < N; ii++)
        arr[ii] = ii;

    std::sort(arr, arr + N, [&](int i, int j) { return order_array[i] > order_array[j]; });

    return arr;
}